

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::startDetached(QProcessPrivate *this,qint64 *pid)

{
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  qint64 qVar6;
  long *in_RSI;
  EVP_PKEY_CTX *pEVar7;
  long in_RDI;
  long in_FS_OFFSET;
  bool success;
  ssize_t startResult;
  int savedErrno;
  pid_t childPid;
  pid_t actualPid;
  int result;
  ChildError childStatus;
  QChildProcess childProcess;
  AutoPipe pidPipe;
  AutoPipe startedPipe;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  ProcessError in_stack_fffffffffffffbac;
  QProcessPrivate *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  int errnoCode;
  QProcessPrivate *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  int iVar8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  qsizetype in_stack_fffffffffffffc08;
  undefined1 *puVar9;
  bool local_389;
  int local_370;
  undefined4 local_36c [11];
  AutoPipe *local_340;
  AutoPipe *local_338;
  undefined1 *local_330;
  undefined1 local_2f8 [512];
  undefined1 local_f8 [208];
  undefined1 *local_28;
  AutoPipe local_18;
  AutoPipe local_10;
  long local_8;
  
  errnoCode = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1185e52::AutoPipe::AutoPipe
            ((AutoPipe *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb9c);
  local_18.pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1185e52::AutoPipe::AutoPipe
            ((AutoPipe *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb9c);
  bVar1 = (anonymous_namespace)::AutoPipe::operator_cast_to_bool((AutoPipe *)&local_10);
  if ((bVar1) &&
     (bVar1 = (anonymous_namespace)::AutoPipe::operator_cast_to_bool((AutoPipe *)&local_18), bVar1))
  {
    bVar1 = openChannelsForDetached(in_stack_fffffffffffffbb0);
    if (bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puVar9 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._192_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._200_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._176_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._184_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._160_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._168_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._144_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._152_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._128_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._136_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_1185e52::QChildProcess::QChildProcess
                ((QChildProcess *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8);
      uVar2 = anon_unknown.dwarf_1185e52::QChildProcess::ok((QChildProcess *)local_f8);
      if ((bool)uVar2) {
        piVar4 = anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_10,1);
        *(int *)(in_RDI + 0x294) = *piVar4;
        local_340 = &local_10;
        local_338 = &local_18;
        local_330 = local_f8;
        pEVar7 = (EVP_PKEY_CTX *)&local_340;
        iVar3 = (anonymous_namespace)::QChildProcess::
                doFork<QProcessPrivate::startDetached(long_long*)::__0>
                          ((QChildProcess *)
                           CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           (anon_class_32_4_344bbdd6 *)
                           CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        *(undefined4 *)(in_RDI + 0x294) = 0xffffffff;
        iVar8 = iVar3;
        __errno_location();
        closeChannels((QProcessPrivate *)
                      CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        if (iVar3 == -1) {
          anon_unknown.dwarf_1185e52::QChildProcess::cleanup((QChildProcess *)local_f8,pEVar7);
          QBasicUtf8StringView<false>::QBasicUtf8StringView<char[5],_true>
                    ((QBasicUtf8StringView<false> *)in_stack_fffffffffffffbb0,
                     (char (*) [5])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          fnName_00.m_data._7_1_ = uVar2;
          fnName_00.m_data._0_7_ = in_stack_fffffffffffffc00;
          fnName_00.m_size = (qsizetype)puVar9;
          anon_unknown.dwarf_1185e52::errorMessageForSyscall(fnName_00,errnoCode);
          setErrorAndEmit(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                          (QString *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          QString::~QString((QString *)0x7a388f);
          local_389 = false;
        }
        else {
          piVar4 = anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_18,1);
          qt_safe_close(in_stack_fffffffffffffba4);
          anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_10,1);
          qt_safe_close(in_stack_fffffffffffffba4);
          piVar5 = anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_10,1);
          *piVar5 = -1;
          piVar5 = anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_18,1);
          *piVar5 = -1;
          memset(local_2f8,0xaa,0x200);
          anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_10,0);
          qVar6 = qt_safe_read((int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                               (void *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                               ,CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          local_36c[0] = 0xaaaaaaaa;
          pEVar7 = (EVP_PKEY_CTX *)local_36c;
          qt_safe_waitpid((pid_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                          (int *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                          in_stack_fffffffffffffba4);
          local_389 = qVar6 == 0;
          if ((local_389) && (in_RSI != (long *)0x0)) {
            local_370 = -0x55555556;
            anon_unknown.dwarf_1185e52::AutoPipe::operator[](&local_18,0);
            in_stack_fffffffffffffbb0 =
                 (QProcessPrivate *)
                 qt_safe_read((int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                              (void *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                              CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
            if (in_stack_fffffffffffffbb0 != (QProcessPrivate *)0x4) {
              local_370 = 0;
            }
            *in_RSI = (long)local_370;
          }
          else if (!local_389) {
            if (in_RSI != (long *)0x0) {
              *in_RSI = -1;
            }
            anon_unknown.dwarf_1185e52::QChildProcess::cleanup((QChildProcess *)local_f8,pEVar7);
            anon_unknown.dwarf_1185e52::startFailureErrorMessage
                      ((ChildError *)CONCAT44(iVar8,in_stack_fffffffffffffbf0),(ssize_t)piVar4);
            setErrorAndEmit(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                            (QString *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                           );
            QString::~QString((QString *)0x7a3af9);
          }
        }
      }
      else {
        local_389 = false;
      }
      anon_unknown.dwarf_1185e52::QChildProcess::~QChildProcess
                ((QChildProcess *)in_stack_fffffffffffffbb0);
    }
    else {
      closeChannels((QProcessPrivate *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                   );
      local_389 = false;
    }
  }
  else {
    QBasicUtf8StringView<false>::QBasicUtf8StringView<char[5],_true>
              ((QBasicUtf8StringView<false> *)in_stack_fffffffffffffbb0,
               (char (*) [5])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    fnName.m_data._7_1_ = in_stack_fffffffffffffc07;
    fnName.m_data._0_7_ = in_stack_fffffffffffffc00;
    fnName.m_size = in_stack_fffffffffffffc08;
    anon_unknown.dwarf_1185e52::errorMessageForSyscall(fnName,errnoCode);
    setErrorAndEmit(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                    (QString *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    QString::~QString((QString *)0x7a35aa);
    local_389 = false;
  }
  anon_unknown.dwarf_1185e52::AutoPipe::~AutoPipe((AutoPipe *)in_stack_fffffffffffffbb0);
  anon_unknown.dwarf_1185e52::AutoPipe::~AutoPipe((AutoPipe *)in_stack_fffffffffffffbb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_389;
}

Assistant:

bool QProcessPrivate::startDetached(qint64 *pid)
{
    AutoPipe startedPipe, pidPipe;
    if (!startedPipe || !pidPipe) {
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
        return false;
    }

    if (!openChannelsForDetached()) {
        // openChannel sets the error string
        closeChannels();
        return false;
    }

    // see startProcess() for more information
    QChildProcess childProcess(this);
    if (!childProcess.ok()) {
        Q_ASSERT(processError != QProcess::UnknownError);
        return false;
    }

    childStartedPipe[1] = startedPipe[1];   // for failChildProcess()
    pid_t childPid = childProcess.doFork([&] {
        ::setsid();

        qt_safe_close(startedPipe[0]);
        qt_safe_close(pidPipe[0]);

        pid_t doubleForkPid;
        if (childProcess.startChild(&doubleForkPid) == -1)
            failChildProcess(this, "fork", errno);

        // success
        qt_safe_write(pidPipe[1], &doubleForkPid, sizeof(pid_t));
        return 0;
    });
    childStartedPipe[1] = -1;

    int savedErrno = errno;
    closeChannels();

    if (childPid == -1) {
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("fork", savedErrno));
        return false;
    }

    // close the writing ends of the pipes so we can properly get EOFs
    qt_safe_close(pidPipe[1]);
    qt_safe_close(startedPipe[1]);
    pidPipe[1] = startedPipe[1] = -1;

    // This read() will block until we're cleared to proceed. If it returns 0
    // (EOF), it means the direct child has exited and the grandchild
    // successfully execve()'d the target process. If it returns any positive
    // result, it means one of the two children wrote an error result. Negative
    // values should not happen.
    ChildError childStatus;
    ssize_t startResult = qt_safe_read(startedPipe[0], &childStatus, sizeof(childStatus));

    // reap the intermediate child
    int result;
    qt_safe_waitpid(childPid, &result, 0);

    bool success = (startResult == 0);  // nothing written -> no error
    if (success && pid) {
        pid_t actualPid;
        if (qt_safe_read(pidPipe[0], &actualPid, sizeof(pid_t)) != sizeof(pid_t))
            actualPid = 0;              // this shouldn't happen!
        *pid = actualPid;
    } else if (!success) {
        if (pid)
            *pid = -1;
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart,
                        startFailureErrorMessage(childStatus, startResult));
    }
    return success;
}